

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::setCursorRowImpl(PatternModel *this,int row,CursorChangeFlags *flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_3c;
  int local_38;
  int local_34;
  int nextPattern;
  int local_2c;
  int local_28;
  int prevPattern;
  int newRow;
  int oldRow;
  CursorChangeFlags *flags_local;
  PatternModel *pPStack_10;
  int row_local;
  PatternModel *this_local;
  
  if (row != (this->mCursor).super_PatternCursorBase.row) {
    prevPattern = (this->mCursor).super_PatternCursorBase.row;
    _newRow = flags;
    flags_local._4_4_ = row;
    pPStack_10 = this;
    if (row < 0) {
      if ((this->mWrapPattern & 1U) == 0) {
        local_28 = 0;
      }
      else {
        if (this->mCursorPattern == 0) {
          local_2c = patterns(this);
        }
        else {
          local_2c = this->mCursorPattern;
        }
        local_2c = local_2c + -1;
        setCursorPatternImpl(this,local_2c,_newRow);
        nextPattern = 0;
        local_34 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
        local_34 = local_34 + flags_local._4_4_;
        piVar3 = std::max<int>(&nextPattern,&local_34);
        local_28 = *piVar3;
      }
    }
    else {
      iVar1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
      if (row < iVar1) {
        local_28 = flags_local._4_4_;
      }
      else if ((this->mWrapPattern & 1U) == 0) {
        local_28 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
        local_28 = local_28 + -1;
      }
      else {
        iVar1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
        flags_local._4_4_ = flags_local._4_4_ - iVar1;
        iVar1 = this->mCursorPattern + 1;
        local_38 = iVar1;
        iVar2 = patterns(this);
        if (iVar1 == iVar2) {
          local_38 = 0;
        }
        setCursorPatternImpl(this,local_38,_newRow);
        local_3c = trackerboy::Pattern::totalRows(&this->mPatternCurr);
        local_3c = local_3c + -1;
        piVar3 = std::min<int>(&local_3c,(int *)((long)&flags_local + 4));
        local_28 = *piVar3;
      }
    }
    if (local_28 != prevPattern) {
      (this->mCursor).super_PatternCursorBase.row = local_28;
      QFlags<PatternModel::CursorChangeFlag>::operator|=(_newRow,CursorRowChanged);
    }
  }
  return;
}

Assistant:

void PatternModel::setCursorRowImpl(int row, CursorChangeFlags &flags) {
    if (row == mCursor.row) {
        return;
    }

    int oldRow = mCursor.row;
    int newRow;
    if (row < 0) {
        // go to the previous pattern or wrap around to the last one
        if (mWrapPattern) {
            int prevPattern;
            if (mCursorPattern == 0) {
                prevPattern = patterns() - 1;
            } else {
                prevPattern = mCursorPattern - 1;
            }
            setCursorPatternImpl(prevPattern, flags);
            newRow = std::max(0, (int)mPatternCurr.totalRows() + row);
        } else {
            newRow = 0;
        }
    } else if (row >= (int)mPatternCurr.totalRows()) {
        if (mWrapPattern) {
            // go to the next pattern or wrap around to the first one
            row -= mPatternCurr.totalRows();
            auto nextPattern = mCursorPattern + 1;
            if (nextPattern == patterns()) {
                nextPattern = 0;
            }
            setCursorPatternImpl(nextPattern, flags);
            newRow = std::min((int)mPatternCurr.totalRows() - 1, row);
        } else {
            newRow = mPatternCurr.totalRows() - 1;
        }
    } else {
        newRow = row;
    }

    if (newRow != oldRow) {
        mCursor.row = newRow;
        flags |= CursorRowChanged;
    }
}